

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void quantize(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  size_type sVar1;
  string *in_RDI;
  FastText *unaff_retaddr;
  FastText fasttext;
  Args a;
  Args *in_stack_fffffffffffffd70;
  string local_288 [24];
  char *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  string local_248 [8];
  Args *in_stack_fffffffffffffdc0;
  TrainCallback *in_stack_fffffffffffffec0;
  Args *in_stack_fffffffffffffec8;
  FastText *in_stack_fffffffffffffed0;
  string *in_stack_ffffffffffffffb8;
  FastText *in_stack_ffffffffffffffc0;
  
  ::fasttext::Args::Args(in_stack_fffffffffffffdc0);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDI);
  if (sVar1 < 3) {
    printQuantizeUsage();
    ::fasttext::Args::printHelp(in_stack_fffffffffffffd70);
    exit(1);
  }
  ::fasttext::Args::parseArgs
            ((Args *)a.manualArgs_._M_h._M_single_bucket,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)a.manualArgs_._M_h._M_rehash_policy._M_next_resize);
  ::fasttext::FastText::FastText((FastText *)in_stack_fffffffffffffda0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  ::fasttext::FastText::loadModel(unaff_retaddr,in_RDI);
  std::__cxx11::string::~string(local_248);
  std::function<void_(float,_float,_double,_double,_long)>::function
            ((function<void_(float,_float,_double,_double,_long)> *)&stack0xfffffffffffffd98);
  ::fasttext::FastText::quantize
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::function<void_(float,_float,_double,_double,_long)>::~function
            ((function<void_(float,_float,_double,_double,_long)> *)0x1d80c3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  ::fasttext::FastText::saveModel(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_288);
  exit(0);
}

Assistant:

void quantize(const std::vector<std::string>& args) {
  Args a = Args();
  if (args.size() < 3) {
    printQuantizeUsage();
    a.printHelp();
    exit(EXIT_FAILURE);
  }
  a.parseArgs(args);
  FastText fasttext;
  // parseArgs checks if a->output is given.
  fasttext.loadModel(a.output + ".bin");
  fasttext.quantize(a);
  fasttext.saveModel(a.output + ".ftz");
  exit(0);
}